

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::protos::gen::TrackEvent::TrackEvent(TrackEvent *this,TrackEvent *param_1)

{
  pointer puVar1;
  pointer pbVar2;
  uint64_t uVar3;
  double dVar4;
  pointer plVar5;
  pointer pdVar6;
  pointer pDVar7;
  int64_t iVar8;
  int64_t iVar9;
  int64_t iVar10;
  int64_t iVar11;
  int64_t iVar12;
  TrackEvent_Type TVar13;
  undefined4 uVar14;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__TrackEvent_00408640;
  puVar1 = (param_1->category_iids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar2 = (param_1->categories_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->categories_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->categories_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->categories_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
  (this->categories_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->categories_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->categories_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->categories_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->categories_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->name_iid_ = param_1->name_iid_;
  ::std::__cxx11::string::string((string *)&this->name_,(string *)&param_1->name_);
  TVar13 = param_1->type_;
  uVar14 = *(undefined4 *)&param_1->field_0x64;
  uVar3 = param_1->track_uuid_;
  dVar4 = param_1->double_counter_value_;
  this->counter_value_ = param_1->counter_value_;
  this->double_counter_value_ = dVar4;
  this->type_ = TVar13;
  *(undefined4 *)&this->field_0x64 = uVar14;
  this->track_uuid_ = uVar3;
  puVar1 = (param_1->extra_counter_track_uuids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->extra_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (param_1->extra_counter_track_uuids_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->extra_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar1;
  (this->extra_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (param_1->extra_counter_track_uuids_).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->extra_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (param_1->extra_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (param_1->extra_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  plVar5 = (param_1->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = plVar5;
  (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (param_1->extra_double_counter_track_uuids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->extra_double_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (param_1->extra_double_counter_track_uuids_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->extra_double_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar1;
  (this->extra_double_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (param_1->extra_double_counter_track_uuids_).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->extra_double_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (param_1->extra_double_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (param_1->extra_double_counter_track_uuids_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pdVar6 = (param_1->extra_double_counter_values_).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar6;
  (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (param_1->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (param_1->terminating_flow_ids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->terminating_flow_ids_).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar1;
  (this->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->terminating_flow_ids_).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar7 = (param_1->debug_annotations_).
           super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->debug_annotations_).
  super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->debug_annotations_).
       super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->debug_annotations_).
  super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar7;
  (this->debug_annotations_).
  super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->debug_annotations_).
       super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->debug_annotations_).
  super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->debug_annotations_).
  super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->debug_annotations_).
  super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  protozero::CopyablePtr<perfetto::protos::gen::TaskExecution>::CopyablePtr
            (&this->task_execution_,&param_1->task_execution_);
  protozero::CopyablePtr<perfetto::protos::gen::LogMessage>::CopyablePtr
            (&this->log_message_,&param_1->log_message_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeCompositorSchedulerState>::CopyablePtr
            (&this->cc_scheduler_state_,&param_1->cc_scheduler_state_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeUserEvent>::CopyablePtr
            (&this->chrome_user_event_,&param_1->chrome_user_event_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeKeyedService>::CopyablePtr
            (&this->chrome_keyed_service_,&param_1->chrome_keyed_service_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeLegacyIpc>::CopyablePtr
            (&this->chrome_legacy_ipc_,&param_1->chrome_legacy_ipc_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeHistogramSample>::CopyablePtr
            (&this->chrome_histogram_sample_,&param_1->chrome_histogram_sample_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeLatencyInfo>::CopyablePtr
            (&this->chrome_latency_info_,&param_1->chrome_latency_info_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeFrameReporter>::CopyablePtr
            (&this->chrome_frame_reporter_,&param_1->chrome_frame_reporter_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeApplicationStateInfo>::CopyablePtr
            (&this->chrome_application_state_info_,&param_1->chrome_application_state_info_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeRendererSchedulerState>::CopyablePtr
            (&this->chrome_renderer_scheduler_state_,&param_1->chrome_renderer_scheduler_state_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeWindowHandleEventInfo>::CopyablePtr
            (&this->chrome_window_handle_event_info_,&param_1->chrome_window_handle_event_info_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeContentSettingsEventInfo>::CopyablePtr
            (&this->chrome_content_settings_event_info_,
             &param_1->chrome_content_settings_event_info_);
  protozero::CopyablePtr<perfetto::protos::gen::SourceLocation>::CopyablePtr
            (&this->source_location_,&param_1->source_location_);
  this->source_location_iid_ = param_1->source_location_iid_;
  protozero::CopyablePtr<perfetto::protos::gen::ChromeMessagePump>::CopyablePtr
            (&this->chrome_message_pump_,&param_1->chrome_message_pump_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeMojoEventInfo>::CopyablePtr
            (&this->chrome_mojo_event_info_,&param_1->chrome_mojo_event_info_);
  iVar8 = param_1->timestamp_delta_us_;
  iVar9 = param_1->timestamp_absolute_us_;
  iVar10 = param_1->thread_time_delta_us_;
  iVar11 = param_1->thread_time_absolute_us_;
  iVar12 = param_1->thread_instruction_count_absolute_;
  this->thread_instruction_count_delta_ = param_1->thread_instruction_count_delta_;
  this->thread_instruction_count_absolute_ = iVar12;
  this->thread_time_delta_us_ = iVar10;
  this->thread_time_absolute_us_ = iVar11;
  this->timestamp_delta_us_ = iVar8;
  this->timestamp_absolute_us_ = iVar9;
  protozero::CopyablePtr<perfetto::protos::gen::TrackEvent_LegacyEvent>::CopyablePtr
            (&this->legacy_event_,&param_1->legacy_event_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TrackEvent::TrackEvent(TrackEvent&&) noexcept = default;